

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O0

int __thiscall SPSUnit::mvc_vui_parameters_extension(SPSUnit *this)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  reference pvVar7;
  reference pvVar8;
  reference pvVar9;
  int beforeCount_1;
  int beforeCount;
  size_t j;
  ulong uStack_50;
  uint vui_mvc_num_target_output_views;
  size_t i;
  undefined1 local_38 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> vui_mvc_temporal_id;
  uint vui_mvc_num_ops;
  SPSUnit *this_local;
  
  uVar3 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
  vui_mvc_temporal_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = uVar3 + 1;
  if (vui_mvc_temporal_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x401) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
               (ulong)vui_mvc_temporal_id.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<int,_std::allocator<int>_>::resize
              (&this->mvcHrdParamsBitPos,
               (ulong)vui_mvc_temporal_id.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize
              (&this->mvcNalHrdParams,
               (ulong)vui_mvc_temporal_id.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_);
    std::vector<HRDParams,_std::allocator<HRDParams>_>::resize
              (&this->mvcVclHrdParams,
               (ulong)vui_mvc_temporal_id.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_);
    for (uStack_50 = 0;
        uStack_50 <
        vui_mvc_temporal_id.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; uStack_50 = uStack_50 + 1) {
      uVar1 = BitStreamReader::getBits<unsigned_char>(&(this->super_NALUnit).bitReader,3);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38,
                          uStack_50);
      *pvVar7 = uVar1;
      uVar3 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
      if (0x400 < uVar3 + 1) {
        this_local._4_4_ = 1;
        goto LAB_00320179;
      }
      for (_beforeCount_1 = 0; _beforeCount_1 < uVar3 + 1; _beforeCount_1 = _beforeCount_1 + 1) {
        uVar4 = NALUnit::extractUEGolombCode(&this->super_NALUnit);
        if (0x3ff < uVar4) {
          this_local._4_4_ = 1;
          goto LAB_00320179;
        }
      }
      bVar2 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
      if (bVar2) {
        BitStreamReader::skipBits(&(this->super_NALUnit).bitReader,0x20);
        BitStreamReader::skipBits(&(this->super_NALUnit).bitReader,0x20);
        BitStreamReader::skipBit(&(this->super_NALUnit).bitReader);
      }
      iVar5 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                         (&this->mvcHrdParamsBitPos,uStack_50);
      *pvVar8 = iVar5 + 0x20;
      bVar2 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
      pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcNalHrdParams,uStack_50);
      pvVar9->isPresent = bVar2;
      pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcNalHrdParams,uStack_50);
      if ((pvVar9->isPresent & 1U) != 0) {
        iVar5 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
        pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcNalHrdParams,uStack_50);
        iVar6 = hrd_parameters(this,pvVar9);
        if (iVar6 != 0) {
          this_local._4_4_ = 1;
          goto LAB_00320179;
        }
        iVar6 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
        pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcNalHrdParams,uStack_50);
        pvVar9->bitLen = iVar6 - iVar5;
      }
      bVar2 = BitStreamReader::getBit(&(this->super_NALUnit).bitReader);
      pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcVclHrdParams,uStack_50);
      pvVar9->isPresent = bVar2;
      pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcVclHrdParams,uStack_50);
      if ((pvVar9->isPresent & 1U) != 0) {
        iVar5 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
        pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcVclHrdParams,uStack_50);
        iVar6 = hrd_parameters(this,pvVar9);
        if (iVar6 != 0) {
          this_local._4_4_ = 1;
          goto LAB_00320179;
        }
        iVar6 = BitStreamReader::getBitsCount(&(this->super_NALUnit).bitReader);
        pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                           (&this->mvcVclHrdParams,uStack_50);
        pvVar9->bitLen = iVar6 - iVar5;
      }
      pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                         (&this->mvcNalHrdParams,uStack_50);
      if (((pvVar9->isPresent & 1U) != 0) ||
         (pvVar9 = std::vector<HRDParams,_std::allocator<HRDParams>_>::operator[]
                             (&this->mvcVclHrdParams,uStack_50), (pvVar9->isPresent & 1U) != 0)) {
        BitStreamReader::skipBit(&(this->super_NALUnit).bitReader);
      }
      BitStreamReader::skipBit(&(this->super_NALUnit).bitReader);
    }
    this_local._4_4_ = 0;
LAB_00320179:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_38);
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int SPSUnit::mvc_vui_parameters_extension()
{
    const unsigned vui_mvc_num_ops = extractUEGolombCode() + 1;
    if (vui_mvc_num_ops > 1 << 10)
        return 1;
    std::vector<uint8_t> vui_mvc_temporal_id;
    vui_mvc_temporal_id.resize(vui_mvc_num_ops);
    mvcHrdParamsBitPos.resize(vui_mvc_num_ops);
    mvcNalHrdParams.resize(vui_mvc_num_ops);
    mvcVclHrdParams.resize(vui_mvc_num_ops);

    for (size_t i = 0; i < vui_mvc_num_ops; i++)
    {
        vui_mvc_temporal_id[i] = bitReader.getBits<uint8_t>(3);
        const unsigned vui_mvc_num_target_output_views = extractUEGolombCode() + 1;
        if (vui_mvc_num_target_output_views > 1 << 10)
            return 1;
        for (size_t j = 0; j < vui_mvc_num_target_output_views; j++)
            if (extractUEGolombCode() >= 1 << 10)  // vui_mvc_view_id[ i ][ j ]
                return 1;

        if (bitReader.getBit())  // vui_mvc_timing_info_present_flag[ i ]
        {
            bitReader.skipBits(32);  // vui_mvc_num_units_in_tick[i]
            bitReader.skipBits(32);  // vui_mvc_time_scale[ i ]
            bitReader.skipBit();     // vui_mvc_fixed_frame_rate_flag[ i ]
        }

        mvcHrdParamsBitPos[i] = bitReader.getBitsCount() + 32;
        mvcNalHrdParams[i].isPresent = bitReader.getBit();
        if (mvcNalHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcNalHrdParams[i]) != 0)
                return 1;
            mvcNalHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        mvcVclHrdParams[i].isPresent = bitReader.getBit();
        if (mvcVclHrdParams[i].isPresent)
        {
            const int beforeCount = bitReader.getBitsCount();
            if (hrd_parameters(mvcVclHrdParams[i]) != 0)
                return 1;
            mvcVclHrdParams[i].bitLen = bitReader.getBitsCount() - beforeCount;
        }
        if (mvcNalHrdParams[i].isPresent || mvcVclHrdParams[i].isPresent)
            bitReader.skipBit();  // vui_mvc_low_delay_hrd_flag[i]
        bitReader.skipBit();      // vui_mvc_pic_struct_present_flag[i]
    }
    return 0;
}